

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.cpp
# Opt level: O2

int find_real_roots_sturm(double *p,int order,double *roots,int *nroots,int maxpow,bool non_neg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  double dVar9;
  int atmin;
  uint *local_8668;
  double local_8660;
  int local_8654;
  double local_8650;
  poly sseq [65];
  
  local_8650 = 1.0;
  dVar9 = p[order];
  for (lVar5 = 0; lVar5 <= order; lVar5 = lVar5 + 1) {
    sseq[0].coef[lVar5] = p[lVar5] * (1.0 / dVar9);
  }
  if (10.0 < ABS(sseq[0].coef[0])) {
    local_8650 = pow(ABS(sseq[0].coef[0]),-1.0 / (double)order);
    dVar9 = local_8650;
    for (uVar4 = (ulong)(uint)order; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
      sseq[0].coef[uVar4 - 1] = dVar9 * sseq[0].coef[uVar4 - 1];
      dVar9 = local_8650 * dVar9;
    }
  }
  iVar1 = buildsturm(order,sseq);
  iVar2 = numroots(iVar1,sseq,&atmin,&local_8654,non_neg);
  *nroots = iVar2;
  if (iVar2 == 0) {
    iVar1 = 0;
  }
  else {
    local_8660 = 0.0;
    if (!non_neg) {
      local_8660 = -1.0;
      local_8668 = (uint *)nroots;
      iVar3 = numchanges(iVar1,sseq,-1.0);
      iVar2 = atmin;
      iVar7 = maxpow;
      while( true ) {
        bVar8 = iVar7 == 0;
        iVar7 = iVar7 + -1;
        if ((iVar3 == iVar2) || (bVar8)) break;
        local_8660 = local_8660 * 10.0;
        iVar3 = numchanges(iVar1,sseq,local_8660);
      }
      nroots = (int *)local_8668;
      if (iVar3 != iVar2) {
        atmin = iVar3;
      }
    }
    local_8668 = (uint *)0x3ff0000000000000;
    iVar2 = numchanges(iVar1,sseq,1.0);
    while( true ) {
      bVar8 = maxpow == 0;
      maxpow = maxpow + -1;
      if ((iVar2 == local_8654) || (bVar8)) break;
      local_8668 = (uint *)((double)local_8668 * 10.0);
      iVar2 = numchanges(iVar1,sseq,(double)local_8668);
    }
    *nroots = atmin - iVar2;
    sbisect(iVar1,sseq,local_8660,(double)local_8668,atmin,iVar2,roots);
    uVar6 = 0;
    uVar4 = (ulong)(uint)*nroots;
    if (*nroots < 1) {
      uVar4 = uVar6;
    }
    iVar1 = 1;
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      roots[uVar6] = roots[uVar6] / local_8650;
    }
  }
  return iVar1;
}

Assistant:

int find_real_roots_sturm( 
	double *p, int order, double *roots, int *nroots, int maxpow, bool non_neg)
   {
   /*
    * finds the roots of the input polynomial.  They are returned in roots.
    * It is assumed that roots is already allocated with space for the roots.
    */

   poly sseq[Maxdegree+1];
   double  min, max;
   int  i, nchanges, np, atmin, atmax;

   // Copy the coefficients from the input p.  Normalize as we go
   double norm = 1.0 / p[order];
   for (i=0; i<=order; i++)
      sseq[0].coef[i] =  p[i] * norm;

   // Now, also normalize the other terms
   double val0 = fabs(sseq[0].coef[0]);
   double fac = 1.0; // This will be a factor for the roots
   if (val0 > 10.0)  // Do this in case there are zero roots
      {
      fac = pow(val0, -1.0/order);
      double mult = fac;
      for (int i=order-1; i>=0; i--)
         {
         sseq[0].coef[i] *= mult;
         mult = mult * fac; 
         }
      }

   /* build the Sturm sequence */
   np = buildsturm(order, sseq);

#ifdef RH_DEBUG
   {
   int i, j;

   printf("Sturm sequence for:\n");
   for (i=order; i>=0; i--)
      printf("%lf ", sseq[0].coef[i]);
   printf("\n\n");

   for (i = 0; i <= np; i++) {
      for (j = sseq[i].ord; j >= 0; j--)
         printf("%10f ", sseq[i].coef[j]);
      printf("\n");
      }

   printf("\n");
   }
#endif

   // get the number of real roots
   *nroots = numroots(np, sseq, &atmin, &atmax, non_neg);

   if (*nroots == 0) {
      // fprintf(stderr, "solve: no real roots\n");
      return 0 ;
      }

   /* calculate the bracket that the roots live in */
   if (non_neg) min = 0.0;
   else
      {
      min = -1.0;
      nchanges = numchanges(np, sseq, min);
      for (i = 0; nchanges != atmin && i != maxpow; i++) { 
         min *= 10.0;
         nchanges = numchanges(np, sseq, min);
         }

      if (nchanges != atmin) {
         //printf("solve: unable to bracket all negative roots\n");
         atmin = nchanges;
         }
      }

   max = 1.0;
   nchanges = numchanges(np, sseq, max);
   for (i = 0; nchanges != atmax && i != maxpow; i++) { 
      max *= 10.0;
      nchanges = numchanges(np, sseq, max);
      }

   if (nchanges != atmax) {
      //printf("solve: unable to bracket all positive roots\n");
      atmax = nchanges;
      }

   *nroots = atmin - atmax;

   /* perform the bisection */
   sbisect(np, sseq, min, max, atmin, atmax, roots);

   /* Finally, reorder the roots */
   for (i=0; i<*nroots; i++)
      roots[i] /= fac;

#ifdef RH_DEBUG

   /* write out the roots */
   printf("Number of roots = %d\n", *nroots);
   for (i=0; i<*nroots; i++)
      printf("%12.5e\n", roots[i]);

#endif

   return 1; 
   }